

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void sha256_write_byte_block(sha256_t *p)

{
  long in_RDI;
  uint i;
  uint32_t data32 [16];
  uint32_t *in_stack_00000098;
  uint32_t *in_stack_000000a0;
  uint local_4c;
  int local_48 [18];
  
  for (local_4c = 0; local_4c < 0x10; local_4c = local_4c + 1) {
    local_48[local_4c] =
         (uint)*(byte *)(in_RDI + 0x28 + (ulong)(local_4c << 2)) * 0x1000000 +
         (uint)*(byte *)(in_RDI + 0x28 + (ulong)(local_4c * 4 + 1)) * 0x10000 +
         (uint)*(byte *)(in_RDI + 0x28 + (ulong)(local_4c * 4 + 2)) * 0x100 +
         (uint)*(byte *)(in_RDI + 0x28 + (ulong)(local_4c * 4 + 3));
  }
  sha256_transform(in_stack_000000a0,in_stack_00000098);
  return;
}

Assistant:

static void
sha256_write_byte_block(sha256_t *p)
{
  uint32_t data32[16];
  unsigned i;
  for (i = 0; i < 16; i++)
    data32[i] =
      ((uint32_t)(p->buffer[i * 4    ]) << 24) +
      ((uint32_t)(p->buffer[i * 4 + 1]) << 16) +
      ((uint32_t)(p->buffer[i * 4 + 2]) <<  8) +
      ((uint32_t)(p->buffer[i * 4 + 3]));
  sha256_transform(p->state, data32);
}